

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O2

void __thiscall
SGParser::Generator::ParseTableProduction::PrintLookAhead
          (ParseTableProduction *this,String *str,
          map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
          *pgrammarSymbolsInv)

{
  _Base_ptr p_Var1;
  bool bVar2;
  _Rb_tree_color _Var3;
  String local_80;
  size_type *local_60;
  String dest;
  _Rb_tree_color local_34 [2];
  uint iTerminal;
  
  local_60 = &dest._M_string_length;
  dest._M_dataplus._M_p = (pointer)0x0;
  dest._M_string_length._0_1_ = 0;
  p_Var1 = (this->LookAhead)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = false;
  dest.field_2._8_8_ = str;
  do {
    if ((_Rb_tree_header *)p_Var1 == &(this->LookAhead)._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::swap((string *)dest.field_2._8_8_);
      std::__cxx11::string::~string((string *)&local_60);
      return;
    }
    local_34[0] = p_Var1[1]._M_color;
    if (bVar2) {
      std::__cxx11::string::append((char *)&local_60);
    }
    _Var3 = local_34[0] & 0xfffffff;
    if (pgrammarSymbolsInv ==
        (map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
         *)0x0) {
      if (_Var3 == _S_black) goto LAB_00131da7;
      if (_Var3 < 0x22) {
        StringWithFormat<char>(&local_80,"x%02X");
        std::__cxx11::string::append((string *)&local_60);
      }
      else {
        StringWithFormat<char>(&local_80,"%c",(ulong)(uint)(int)(char)((char)local_34[0] + -2));
        std::__cxx11::string::append((string *)&local_60);
      }
      std::__cxx11::string::~string((string *)&local_80);
    }
    else if (_Var3 == _S_black) {
LAB_00131da7:
      std::__cxx11::string::append((char *)&local_60);
    }
    else {
      std::
      map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
      ::operator[](pgrammarSymbolsInv,local_34);
      std::__cxx11::string::append((string *)&local_60);
    }
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    bVar2 = true;
  } while( true );
}

Assistant:

void ParseTableProduction::PrintLookAhead(String& str,
                                   std::map<unsigned, const String*>* pgrammarSymbolsInv) const {
    String dest;
    bool   flag = false;

    for (const auto iTerminal : LookAhead) {
        if (flag)
            dest += " ";
        flag = true;

        const auto terminal = iTerminal & ProductionMask::TerminalValue;

        if (pgrammarSymbolsInv) {
            if (terminal == TokenCode::TokenEOF)
                dest += "EOF";
            else
                dest += *(*pgrammarSymbolsInv)[iTerminal];
        } else {
            if (terminal == TokenCode::TokenEOF)
                dest += "EOF";
            else if (terminal < 32u + TokenCode::TokenFirstID)
                dest += StringWithFormat("x%02X", terminal);
            else
                dest += StringWithFormat("%c", char(terminal - TokenCode::TokenFirstID));
        }
    }

    str.swap(dest);
}